

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONChildren.cpp
# Opt level: O0

void jsonChildren::reserve2(jsonChildren **mine,json_index_t amount)

{
  json_index_t amount_local;
  jsonChildren **mine_local;
  
  if ((*mine)->array == (JSONNode **)0x0) {
    reserve(*mine,amount);
  }
  else if ((*mine)->mycapacity < amount) {
    inc(*mine,amount - (*mine)->mycapacity);
  }
  return;
}

Assistant:

void jsonChildren::reserve2(jsonChildren *& mine, json_index_t amount) json_nothrow {
    if (mine -> array != 0){
	   if (mine -> mycapacity < amount){
		  mine -> inc(amount - mine -> mycapacity);
		  #ifdef JSON_LESS_MEMORY
			 mine = jsonChildren_Reserved::newChildren_Reserved(mine, amount);
		  #endif
	   }
    } else {
	   mine -> reserve(amount);
    }
}